

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O2

void initEndData(chainEndData_t *ed)

{
  long lVar1;
  
  for (lVar1 = -0x40; lVar1 != 0; lVar1 = lVar1 + 8) {
    *(undefined8 *)((long)ed->ambigO + lVar1) = 0;
    *(undefined8 *)((long)ed->hisNHcount + lVar1 + -0x14) = 0;
  }
  ed->res_mc_oxy_cnt = 0;
  ed->first = 0;
  ed->last = 0;
  ed->Ntmarkers = 0;
  ed->Ctmarkers = 0;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    ed->hisNHcount[lVar1] = 0;
  }
  return;
}

Assistant:

void initEndData(chainEndData_t *ed)
{
   int i = 0;
   for (i = 0; i < 8; i++) { ed->ambigN[i] = NULL; ed->ambigO[i] = NULL; }
   ed->res_mc_oxy_cnt = 0;
   ed->first = 0;
   ed->last  = 0;
   ed->Ntmarkers = 0;
   ed->Ctmarkers = 0;
   for (i = 0; i < 4; i++) { ed->hisNHcount[i] = 0; }
}